

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O0

uint * Cec_ManSimSimDeref(Cec_ManSim_t *p,int i)

{
  uint uVar1;
  uint *puVar2;
  uint *pSim;
  int i_local;
  Cec_ManSim_t *p_local;
  
  if (0 < p->pSimInfo[i]) {
    puVar2 = p->pMems + p->pSimInfo[i];
    uVar1 = *puVar2;
    *puVar2 = uVar1 - 1;
    if (uVar1 - 1 == 0) {
      *puVar2 = p->MemFree;
      p->MemFree = p->pSimInfo[i];
      p->pSimInfo[i] = 0;
      p->nMems = p->nMems + -1;
    }
    return puVar2;
  }
  __assert_fail("p->pSimInfo[i] > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                ,0x1bc,"unsigned int *Cec_ManSimSimDeref(Cec_ManSim_t *, int)");
}

Assistant:

unsigned * Cec_ManSimSimDeref( Cec_ManSim_t * p, int i )
{
    unsigned * pSim;
    assert( p->pSimInfo[i] > 0 );
    pSim = p->pMems + p->pSimInfo[i];
    if ( --pSim[0] == 0 )
    {
        pSim[0] = p->MemFree;
        p->MemFree = p->pSimInfo[i];
        p->pSimInfo[i] = 0;
        p->nMems--;
    }
    return pSim;
}